

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdmath.cpp
# Opt level: O2

SQRESULT sqstd_register_mathlib(HSQUIRRELVM v)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  
  for (lVar3 = 0x18; lVar3 != 600; lVar3 = lVar3 + 0x20) {
    uVar1 = *(undefined8 *)((long)&PTR_typeinfo_name_0010f688 + lVar3);
    uVar2 = *(undefined8 *)((long)&PTR_typeinfo_0010f690 + lVar3);
    sq_pushstring(v,uVar1,0xffffffffffffffff);
    sq_newclosure(v,uVar2,0);
    sq_setparamscheck(v,*(undefined8 *)(&UNK_0010f698 + lVar3),
                      *(undefined8 *)((long)&mathlib_funcs[0].name + lVar3));
    sq_setnativeclosurename(v,0xffffffffffffffff,uVar1);
    sq_newslot(v,0xfffffffffffffffd,0);
  }
  sq_pushstring(v,"RAND_MAX",0xffffffffffffffff);
  sq_pushinteger(v,0x7fffffff);
  sq_newslot(v,0xfffffffffffffffd,0);
  sq_pushstring(v,"PI",0xffffffffffffffff);
  sq_pushfloat(0x40490fdb,v);
  sq_newslot(v,0xfffffffffffffffd,0);
  return 0;
}

Assistant:

SQRESULT sqstd_register_mathlib(HSQUIRRELVM v)
{
    SQInteger i=0;
    while(mathlib_funcs[i].name!=0) {
        sq_pushstring(v,mathlib_funcs[i].name,-1);
        sq_newclosure(v,mathlib_funcs[i].f,0);
        sq_setparamscheck(v,mathlib_funcs[i].nparamscheck,mathlib_funcs[i].typemask);
        sq_setnativeclosurename(v,-1,mathlib_funcs[i].name);
        sq_newslot(v,-3,SQFalse);
        i++;
    }
    sq_pushstring(v,_SC("RAND_MAX"),-1);
    sq_pushinteger(v,RAND_MAX);
    sq_newslot(v,-3,SQFalse);
    sq_pushstring(v,_SC("PI"),-1);
    sq_pushfloat(v,(SQFloat)M_PI);
    sq_newslot(v,-3,SQFalse);
    return SQ_OK;
}